

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::~Tables(Tables *this)

{
  bool bVar1;
  LogMessage *other;
  size_type sVar2;
  reference ppvVar3;
  int local_50;
  LogFinisher local_4a;
  byte local_49;
  int i;
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
          ::empty(&this->checkpoints_);
  local_49 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x227);
    local_49 = 1;
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&i,"CHECK failed: checkpoints_.empty(): ");
    internal::LogFinisher::operator=(&local_4a,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&i);
  }
  STLDeleteElements<std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
            (&this->messages_);
  for (local_50 = 0; sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->allocations_)
      , (ulong)(long)local_50 < sVar2; local_50 = local_50 + 1) {
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->allocations_,(long)local_50);
    operator_delete(*ppvVar3);
  }
  STLDeleteElements<std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>>
            (&this->strings_);
  STLDeleteElements<std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>
            (&this->file_tables_);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::~vector(&this->extensions_after_checkpoint_);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&this->files_after_checkpoint_);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            (&this->symbols_after_checkpoint_);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::~vector(&this->checkpoints_);
  std::
  map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::~map(&this->extensions_);
  hash_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq>
  ::~hash_map(&this->files_by_name_);
  hash_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq>
  ::~hash_map(&this->symbols_by_name_);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->allocations_);
  std::
  vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
  ::~vector(&this->file_tables_);
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::~vector
            (&this->messages_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~vector(&this->strings_);
  hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
  ::~hash_set(&this->extensions_loaded_from_db_);
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~hash_set(&this->known_bad_files_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->pending_files_);
  return;
}

Assistant:

DescriptorPool::Tables::~Tables() {
  GOOGLE_DCHECK(checkpoints_.empty());
  // Note that the deletion order is important, since the destructors of some
  // messages may refer to objects in allocations_.
  STLDeleteElements(&messages_);
  for (int i = 0; i < allocations_.size(); i++) {
    operator delete(allocations_[i]);
  }
  STLDeleteElements(&strings_);
  STLDeleteElements(&file_tables_);
}